

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O3

void * prf_array_set_size(void *id,int newsize)

{
  uint uVar1;
  int *piVar2;
  
  uVar1 = *(uint *)((long)id + -4);
  piVar2 = (int *)realloc((void *)((long)id + -8),(ulong)(uVar1 & 0xf) * (long)newsize + 8);
  *piVar2 = newsize;
  piVar2[1] = uVar1;
  return piVar2 + 2;
}

Assistant:

void *
prf_array_set_size(void *id, int newsize)
{
  array *oldarray;
  array *newarray; 
  int elemsize;
  int numelem;

  oldarray = id_to_array(id);
  elemsize = oldarray->elemsize;
  numelem = oldarray->numelem;
  newarray = (array *)profit_realloc(oldarray,
                                     (size_t)newsize*elemsize + sizeof(array));
  
  newarray->size = newsize;
  newarray->elemsize = elemsize;
  newarray->numelem = numelem;
  
  return prf_array_to_id(newarray);
}